

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O2

UBool __thiscall icu_63::TimeZone::operator==(TimeZone *this,TimeZone *that)

{
  bool bVar1;
  UBool UVar2;
  
  bVar1 = std::type_info::operator==
                    ((type_info *)(this->super_UObject)._vptr_UObject[-1],
                     (type_info *)(that->super_UObject)._vptr_UObject[-1]);
  if (bVar1) {
    UVar2 = UnicodeString::operator==(&this->fID,&that->fID);
    bVar1 = UVar2 != '\0';
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

UBool
TimeZone::operator==(const TimeZone& that) const
{
    return typeid(*this) == typeid(that) &&
        fID == that.fID;
}